

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O2

bool ON_EvaluateNurbsBasisDerivatives(int order,double *knot,int der_count,double *N)

{
  double *pdVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  double *pdVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double *local_2e8;
  double stack_buffer [80];
  
  lVar8 = (long)(((order >> 1) + 2) * order);
  uVar10 = (der_count + lVar8) * 8 + 8;
  uVar15 = 0;
  if (uVar10 < 0x281) {
    pdVar3 = stack_buffer;
    local_2e8 = (double *)0x0;
  }
  else {
    pdVar3 = (double *)onmalloc(uVar10);
    local_2e8 = pdVar3;
  }
  lVar4 = (long)order;
  pdVar19 = pdVar3 + lVar4;
  pdVar1 = pdVar3 + lVar8;
  pdVar5 = pdVar19 + lVar4;
  *pdVar1 = (double)pdVar5;
  lVar17 = (long)(order + -1);
  lVar8 = lVar17 * 8;
  uVar10 = 0;
  pdVar14 = knot;
  if (0 < der_count) {
    uVar10 = (ulong)(uint)der_count;
  }
  for (; uVar15 != uVar10; uVar15 = uVar15 + 1) {
    for (lVar11 = 0; lVar11 < (long)(lVar17 - uVar15); lVar11 = lVar11 + 1) {
      pdVar5[lVar11] = 1.0 / (knot[lVar17 + lVar11] - pdVar14[lVar11]);
    }
    pdVar5 = (double *)((long)pdVar5 + lVar8);
    pdVar1[uVar15 + 1] = (double)pdVar5;
    lVar8 = lVar8 + -8;
    pdVar14 = pdVar14 + 1;
  }
  pdVar5 = N + lVar4;
  lVar8 = 0;
  uVar15 = 0;
  if (0 < order) {
    uVar15 = (ulong)(uint)order;
  }
  uVar7 = 1;
  lVar11 = -8;
  for (uVar16 = 0; uVar16 != uVar15; uVar16 = uVar16 + 1) {
    *pdVar3 = 1.0;
    lVar12 = (long)pdVar5 + lVar8;
    uVar18 = 1;
    lVar9 = lVar11;
    pdVar14 = pdVar3;
    uVar6 = uVar7;
    while( true ) {
      pdVar3 = pdVar14;
      uVar2 = 1;
      if (1 < (int)uVar6) {
        uVar2 = uVar6;
      }
      uVar13 = (ulong)uVar2;
      if (uVar18 == (int)uVar10 + 1) break;
      dVar21 = 0.0;
      if (uVar18 <= uVar16) {
        dVar21 = *pdVar3 * *(double *)((long)pdVar1[uVar18 - 1] + (uVar16 - uVar18) * 8);
        *pdVar19 = dVar21;
        dVar21 = dVar21 * pdVar5[uVar16];
      }
      if ((long)(lVar17 - uVar16) < (long)uVar18) {
        for (; (long)uVar13 <= (long)(lVar17 - uVar16); uVar13 = uVar13 + 1) {
          dVar22 = (pdVar3[uVar13] - pdVar3[uVar13 - 1]) *
                   *(double *)((long)pdVar1[uVar18 - 1] + lVar9 + uVar13 * 8);
          pdVar19[uVar13] = dVar22;
          dVar21 = dVar21 + dVar22 * *(double *)(lVar12 + uVar13 * 8);
        }
      }
      else {
        for (; uVar13 < uVar18; uVar13 = uVar13 + 1) {
          dVar22 = (pdVar3[uVar13] - pdVar3[uVar13 - 1]) *
                   *(double *)((long)pdVar1[uVar18 - 1] + lVar9 + uVar13 * 8);
          pdVar19[uVar13] = dVar22;
          dVar21 = dVar21 + dVar22 * *(double *)(lVar12 + uVar13 * 8);
        }
        dVar22 = -pdVar3[uVar18 - 1] * *(double *)((long)pdVar1[uVar18 - 1] + uVar16 * 8);
        pdVar19[uVar18] = dVar22;
        dVar21 = dVar21 + dVar22 * pdVar5[uVar18 + uVar16];
      }
      pdVar5[uVar16] = dVar21;
      pdVar5 = pdVar5 + lVar4;
      uVar18 = uVar18 + 1;
      uVar6 = uVar6 + 1;
      lVar12 = lVar12 + lVar4 * 8;
      lVar9 = lVar9 + -8;
      pdVar14 = pdVar19;
      pdVar19 = pdVar3;
    }
    pdVar5 = pdVar5 + -(order * der_count);
    uVar7 = uVar7 - 1;
    lVar8 = lVar8 + 8;
    lVar11 = lVar11 + 8;
  }
  dVar22 = (double)(order + -1);
  dVar21 = dVar22;
  while (bVar20 = der_count != 0, der_count = der_count + -1, uVar10 = (ulong)(uint)order, bVar20) {
    while ((int)uVar10 != 0) {
      *pdVar5 = *pdVar5 * dVar22;
      pdVar5 = pdVar5 + 1;
      uVar10 = (ulong)((int)uVar10 - 1);
    }
    dVar21 = dVar21 + -1.0;
    dVar22 = dVar22 * dVar21;
  }
  if (local_2e8 != (double *)0x0) {
    onfree(local_2e8);
  }
  return true;
}

Assistant:

bool ON_EvaluateNurbsBasisDerivatives(
  int order,
  const double* knot, 
  int der_count,
  double* N 
)
{
	double dN, c;
	const double *k0, *k1;
	double *a0, *a1, *ptr, **dk;
	int i, j, k, jmax;

	const int d = order-1;
	const int Nstride = -der_count*order;

	/* workspaces for knot differences and coefficients 
	 *
	 * a0[] and a1[] have order doubles
	 *
	 * dk[0] = array of d knot differences
	 * dk[1] = array of (d-1) knot differences
	 *
	 * dk[der_count-1] = 1.0/(knot[d] - knot[d-1])
	 * dk[der_count] = dummy pointer to make loop efficient
	 */

	//dk = (double**)alloca( (der_count+1) << 3 ); /* << 3 in case pointers are 8 bytes long */
	//a0 = (double*)alloca( (order*(2 + ((d+1)>>1))) << 3 ); /* d for a0, d for a1, d*order/2 for dk[]'s and slop to avoid /2 */
	//a1 = a0 + order;

  double stack_buffer[80];
  void* heap_buffer = 0;
  const size_t dbl_count = (order*(2 + ((d+1)>>1)));
  const size_t sz = ( dbl_count*sizeof(*a0) + (der_count+1)*sizeof(*dk) );

  a0 = (sz <= sizeof(stack_buffer)) ? stack_buffer : (double*)(heap_buffer = onmalloc(sz));
	a1 = a0 + order;
  dk = (double**)(a0 + dbl_count);

	/* initialize reciprocal of knot differences */
	dk[0] = a1 + order;
	for (k = 0; k < der_count; k++) {
		j = d-k;
		k0 = knot++;
		k1 = k0 + j;
		for (i = 0; i < j; i++) 
			dk[k][i] = 1.0/(*k1++ - *k0++);
		dk[k+1] = dk[k] + j;
	}
	dk--;
	/* dk[1] = 1/{t[d]-t[0], t[d+1]-t[1], ..., t[2d-2] - t[d-2], t[2d-1] - t[d-1]}
	 *       = diffs needed for 1rst derivative
	 * dk[2] = 1/{t[d]-t[1], t[d+1]-t[2], ..., t[2d-2] - t[d-1]}
	 *       = diffs needed for 2nd derivative
	 * ...
	 * dk[d] = 1/{t[d] - t[d-1]}
	 *       = diff needed for d-th derivative
	 *
	 * d[k][n] = 1.0/( t[d+n] - t[k-1+n] )
	 */
	
	N += order;
	/* set N[0] ,..., N[d] = 1rst derivatives, 
	 * N[order], ..., N[order+d] = 2nd, etc.
	 */
	for ( i=0; i<order; i++) {
		a0[0] = 1.0;
		for (k = 1; k <= der_count; k++) {
			/* compute k-th derivative of N_i^d up to d!/(d-k)! scaling factor */
			dN = 0.0;
			j = k-i; 
			if (j <= 0) {
				dN = (a1[0] = a0[0]*dk[k][i-k])*N[i];
				j = 1;
			}
			jmax = d-i; 
			if (jmax < k) {
				while (j <= jmax) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
			}
			else {
				/* sum j all the way to j = k */
				while (j < k) {
					dN += (a1[j] = (a0[j] - a0[j-1])*dk[k][i+j-k])*N[i+j];
					j++;
				}
				dN += (a1[k] = -a0[k-1]*dk[k][i])*N[i+k];
			}

			/* d!/(d-k)!*dN = value of k-th derivative */
			N[i] = dN;
			N += order;
			/* a1[] s for next derivative = linear combination
			 * of a[]s used to compute this derivative.
			 */
			ptr = a0; a0 = a1; a1 = ptr;
		}
		N += Nstride;
	}

	/* apply d!/(d-k)! scaling factor */
	dN = c = (double)d;
	k = der_count;
	while (k--) {
		i = order;
		while (i--)
			*N++ *= c;
		dN -= 1.0;
		c *= dN;
	}

  if ( 0 != heap_buffer )
    onfree(heap_buffer);

  return true;
}